

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O0

int __thiscall
jaegertracing::samplers::RemotelyControlledSampler::close(RemotelyControlledSampler *this,int __fd)

{
  bool bVar1;
  uint local_24;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  RemotelyControlledSampler *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->_mutex);
  bVar1 = (this->_running & 1U) != 0;
  if (bVar1) {
    this->_running = false;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_20);
    std::condition_variable::notify_one();
  }
  local_24 = (uint)!bVar1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  if (local_24 == 0) {
    local_24 = std::thread::join();
  }
  return local_24;
}

Assistant:

void RemotelyControlledSampler::close()
{
    {
        std::unique_lock<std::mutex> lock(_mutex);
        if (!_running) {
            return;
        }
        _running = false;
        lock.unlock();
        _shutdownCV.notify_one();
    }
    _thread.join();
}